

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuarticBondType.hpp
# Opt level: O0

void __thiscall
OpenMD::QuarticBondType::calcForce(QuarticBondType *this,RealType r,RealType *V,RealType *dVdr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  RealType dr4;
  RealType dr3;
  RealType dr2;
  RealType dr;
  RealType *dVdr_local;
  RealType *V_local;
  RealType r_local;
  QuarticBondType *this_local;
  
  dVar1 = r - (this->super_BondType).r0;
  dVar2 = dVar1 * dVar1;
  dVar3 = dVar2 * dVar1;
  *V = this->k4_ * dVar3 * dVar1 +
       this->k3_ * dVar3 + this->k2_ * dVar2 + this->k1_ * dVar1 + this->k0_;
  *dVdr = this->k4_ * 4.0 * dVar3 + this->k3_ * 3.0 * dVar2 + this->k2_ * 2.0 * dVar1 + this->k1_;
  return;
}

Assistant:

virtual void calcForce(RealType r, RealType& V, RealType& dVdr) {
      RealType dr  = r - r0;
      RealType dr2 = dr * dr;
      RealType dr3 = dr2 * dr;
      RealType dr4 = dr3 * dr;

      V    = k0_ + k1_ * dr + k2_ * dr2 + k3_ * dr3 + k4_ * dr4;
      dVdr = k1_ + 2.0 * k2_ * dr + 3.0 * k3_ * dr2 + 4.0 * k4_ * dr3;
    }